

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O0

float ComputeNextQ(PassStats *s)

{
  int *in_RDI;
  float fVar1;
  double slope;
  float dq;
  float local_1c;
  float local_c;
  
  if (*in_RDI == 0) {
    if ((*(double *)(in_RDI + 6) != *(double *)(in_RDI + 8)) ||
       (NAN(*(double *)(in_RDI + 6)) || NAN(*(double *)(in_RDI + 8)))) {
      local_c = (float)(((*(double *)(in_RDI + 10) - *(double *)(in_RDI + 6)) /
                        (*(double *)(in_RDI + 8) - *(double *)(in_RDI + 6))) *
                       (double)((float)in_RDI[3] - (float)in_RDI[2]));
    }
    else {
      local_c = 0.0;
    }
  }
  else {
    if (*(double *)(in_RDI + 6) < *(double *)(in_RDI + 10) ||
        *(double *)(in_RDI + 6) == *(double *)(in_RDI + 10)) {
      local_1c = (float)in_RDI[1];
    }
    else {
      local_1c = -(float)in_RDI[1];
    }
    local_c = local_1c;
    *in_RDI = 0;
  }
  fVar1 = Clamp(local_c,-30.0,30.0);
  in_RDI[1] = (int)fVar1;
  in_RDI[3] = in_RDI[2];
  *(undefined8 *)(in_RDI + 8) = *(undefined8 *)(in_RDI + 6);
  fVar1 = Clamp((float)in_RDI[2] + (float)in_RDI[1],(float)in_RDI[4],(float)in_RDI[5]);
  in_RDI[2] = (int)fVar1;
  return (float)in_RDI[2];
}

Assistant:

static float ComputeNextQ(PassStats* const s) {
  float dq;
  if (s->is_first) {
    dq = (s->value > s->target) ? -s->dq : s->dq;
    s->is_first = 0;
  } else if (s->value != s->last_value) {
    const double slope = (s->target - s->value) / (s->last_value - s->value);
    dq = (float)(slope * (s->last_q - s->q));
  } else {
    dq = 0.;  // we're done?!
  }
  // Limit variable to avoid large swings.
  s->dq = Clamp(dq, -30.f, 30.f);
  s->last_q = s->q;
  s->last_value = s->value;
  s->q = Clamp(s->q + s->dq, s->qmin, s->qmax);
  return s->q;
}